

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyPoint2Point.cpp
# Opt level: O2

void __thiscall btMultiBodyPoint2Point::debugDraw(btMultiBodyPoint2Point *this,btIDebugDraw *drawer)

{
  btMultiBody *pbVar1;
  
  if (this->m_rigidBodyA != (btRigidBody *)0x0) {
    btTransform::operator()
              (&(this->m_rigidBodyA->super_btCollisionObject).m_worldTransform,&this->m_pivotInA);
    (*drawer->_vptr_btIDebugDraw[0x10])(0x3dcccccd,drawer);
  }
  pbVar1 = (this->super_btMultiBodyConstraint).m_bodyA;
  if (pbVar1 != (btMultiBody *)0x0) {
    btMultiBody::localPosToWorld
              (pbVar1,(this->super_btMultiBodyConstraint).m_linkA,&this->m_pivotInA);
    (*drawer->_vptr_btIDebugDraw[0x10])(0x3dcccccd,drawer);
  }
  if (this->m_rigidBodyB != (btRigidBody *)0x0) {
    btTransform::operator()
              (&(this->m_rigidBodyB->super_btCollisionObject).m_worldTransform,&this->m_pivotInB);
    (*drawer->_vptr_btIDebugDraw[0x10])(0x3dcccccd,drawer);
  }
  pbVar1 = (this->super_btMultiBodyConstraint).m_bodyB;
  if (pbVar1 != (btMultiBody *)0x0) {
    btMultiBody::localPosToWorld
              (pbVar1,(this->super_btMultiBodyConstraint).m_linkB,&this->m_pivotInB);
    (*drawer->_vptr_btIDebugDraw[0x10])(0x3dcccccd,drawer);
  }
  return;
}

Assistant:

void btMultiBodyPoint2Point::debugDraw(class btIDebugDraw* drawer)
{
	btTransform tr;
	tr.setIdentity();

	if (m_rigidBodyA)
	{
		btVector3 pivot = m_rigidBodyA->getCenterOfMassTransform() * m_pivotInA;
		tr.setOrigin(pivot);
		drawer->drawTransform(tr, 0.1);
	}
	if (m_bodyA)
	{
		btVector3 pivotAworld = m_bodyA->localPosToWorld(m_linkA, m_pivotInA);
		tr.setOrigin(pivotAworld);
		drawer->drawTransform(tr, 0.1);
	}
	if (m_rigidBodyB)
	{
		// that ideally should draw the same frame
		btVector3 pivot = m_rigidBodyB->getCenterOfMassTransform() * m_pivotInB;
		tr.setOrigin(pivot);
		drawer->drawTransform(tr, 0.1);
	}
	if (m_bodyB)
	{
		btVector3 pivotBworld = m_bodyB->localPosToWorld(m_linkB, m_pivotInB);
		tr.setOrigin(pivotBworld);
		drawer->drawTransform(tr, 0.1);
	}
}